

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,_unsigned_short,_0>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,unsigned_short *rhs,uchar *result)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  undefined1 *in_RDX;
  ushort *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  bVar1 = *in_RDI;
  uVar2 = *in_RSI;
  bVar3 = std::numeric_limits<unsigned_char>::max();
  if ((uint)bVar1 + (uint)uVar2 <= (uint)bVar3) {
    *in_RDX = (char)((uint)bVar1 + (uint)uVar2);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }